

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

size_t __thiscall mir::inst::MirFunction::variable_table_size(MirFunction *this)

{
  bool bVar1;
  element_type *peVar2;
  int *piVar3;
  long in_RDI;
  optional<int> s;
  pair<const_unsigned_int,_mir::inst::Variable> *v;
  const_iterator __end2;
  const_iterator __begin2;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *__range2;
  size_t size;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  long local_18;
  size_t local_10;
  
  local_10 = 0;
  local_18 = in_RDI + 0x38;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
    in_stack_ffffffffffffffd0 =
         std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::
         operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                   in_stack_ffffffffffffffd0);
    peVar2 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2bed84);
    (*(peVar2->super_Displayable)._vptr_Displayable[3])();
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x2bed99);
    if (bVar1) {
      piVar3 = std::optional<int>::value((optional<int> *)in_stack_ffffffffffffffd0);
      local_10 = (long)*piVar3 + local_10;
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
               in_stack_ffffffffffffffd0);
  }
  return local_10;
}

Assistant:

size_t MirFunction::variable_table_size() const {
  size_t size = 0;
  for (auto& v : variables) {
    auto s = v.second.ty->size();
    if (s) size += s.value();
  }
  return size;
}